

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int check_const_addr_p(c2m_ctx_t c2m_ctx,node_t_conflict r,node_t_conflict *base,mir_llong *offset,
                      int *deref)

{
  check_ctx *pcVar1;
  byte *pbVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  node_t_conflict pnVar6;
  mir_size_t mVar7;
  type *local_d0;
  mir_size_t local_c0;
  type *local_b8;
  expr_conflict *op_e;
  node_t_conflict op;
  mir_size_t size;
  decl_spec *decl_spec;
  decl_t decl;
  node_t_conflict temp;
  node_t_conflict op2;
  node_t_conflict op1;
  type *type;
  expr_conflict *e;
  check_ctx_t check_ctx;
  int *deref_local;
  mir_llong *offset_local;
  node_t_conflict *base_local;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  pcVar1 = c2m_ctx->check_ctx;
  pbVar2 = (byte *)r->attr;
  if (((*pbVar2 & 1) == 0) || (iVar5 = integer_type_p(*(type **)(pbVar2 + 0x18)), iVar5 == 0)) {
    switch(r->code) {
    case N_STR:
    case N_STR16:
    case N_STR32:
      *base = r;
      *offset = 0;
      *deref = 0;
      c2m_ctx_local._4_4_ = (uint)(pcVar1->curr_scope == c2m_ctx->top_scope);
      break;
    case N_ID:
      if (*(long *)(pbVar2 + 0x10) == 0) {
        c2m_ctx_local._4_4_ = 0;
      }
      else {
        if ((**(int **)(pbVar2 + 0x10) == 0x7d) ||
           ((**(int **)(pbVar2 + 0x10) == 0x55 &&
            (*(int *)(*(long *)(*(long *)(*(long *)(pbVar2 + 0x10) + 8) + 0x40) + 0x18) == 7)))) {
          *base = *(node_t_conflict *)(pbVar2 + 0x10);
          *deref = 0;
        }
        else {
          if ((*(long *)(pbVar2 + 8) == 0) ||
             ((*(node_t_conflict *)(*(long *)(*(long *)(pbVar2 + 8) + 8) + 0x18) !=
               c2m_ctx->top_scope && (*(int *)(*(long *)(*(long *)(pbVar2 + 8) + 8) + 0x38) != 0))))
          {
            return 0;
          }
          *base = *(node_t_conflict *)(pbVar2 + 0x10);
          *deref = (uint)(*(long *)(*(long *)(pbVar2 + 0x18) + 8) == 0);
        }
        *offset = 0;
        c2m_ctx_local._4_4_ = 1;
      }
      break;
    default:
      c2m_ctx_local._4_4_ = 0;
      break;
    case N_ADD:
    case N_SUB:
      pnVar6 = DLIST_node_t_el(&(r->u).ops,1);
      if (pnVar6 == (node_t_conflict)0x0) {
        c2m_ctx_local._4_4_ = 0;
      }
      else {
        op2 = DLIST_node_t_head(&(r->u).ops);
        temp = pnVar6;
        if ((r->code == N_ADD) && ((*op2->attr & 1) != 0)) {
          temp = op2;
          op2 = pnVar6;
        }
        iVar5 = check_const_addr_p(c2m_ctx,op2,base,offset,deref);
        if (iVar5 == 0) {
          c2m_ctx_local._4_4_ = 0;
        }
        else if ((*deref == 0) || (*(long *)(*(long *)((long)op2->attr + 0x18) + 8) != 0)) {
          pbVar2 = (byte *)temp->attr;
          if (((*pbVar2 & 1) == 0) &&
             ((((*pbVar2 >> 1 & 1) == 0 || (*(long *)(pbVar2 + 0x10) == 0)) ||
              (**(int **)(pbVar2 + 0x10) != 0x53)))) {
            c2m_ctx_local._4_4_ = 0;
          }
          else {
            lVar4 = *(long *)((long)r->attr + 0x18);
            if ((*(int *)(lVar4 + 0x18) != 1) && (*(int *)(lVar4 + 0x18) != 3)) {
              __assert_fail("type->mode == TM_BASIC || type->mode == TM_PTR",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x1d85,
                            "int check_const_addr_p(c2m_ctx_t, node_t, node_t *, mir_llong *, int *)"
                           );
            }
            if ((*(int *)(lVar4 + 0x18) == 1) || (*(int *)(*(long *)(lVar4 + 0x30) + 0x18) == 7)) {
              local_c0 = 1;
            }
            else {
              if (*(long *)(*(long *)(lVar4 + 0x30) + 8) == 0) {
                local_d0 = *(type **)(lVar4 + 0x30);
              }
              else {
                local_d0 = *(type **)(*(long *)(lVar4 + 0x30) + 8);
              }
              local_c0 = type_size(c2m_ctx,local_d0);
            }
            if (r->code == N_ADD) {
              *offset = *(long *)(pbVar2 + 0x30) * local_c0 + *offset;
            }
            else {
              *offset = *offset - *(long *)(pbVar2 + 0x30) * local_c0;
            }
            c2m_ctx_local._4_4_ = 1;
          }
        }
        else {
          c2m_ctx_local._4_4_ = 0;
        }
      }
      break;
    case N_IND:
      pnVar6 = DLIST_node_t_head(&(r->u).ops);
      if (*(int *)(*(long *)((long)pnVar6->attr + 0x18) + 0x18) == 3) {
        pnVar6 = DLIST_node_t_head(&(r->u).ops);
        iVar5 = check_const_addr_p(c2m_ctx,pnVar6,base,offset,deref);
        if (iVar5 == 0) {
          c2m_ctx_local._4_4_ = 0;
        }
        else {
          pnVar6 = DLIST_node_t_el(&(r->u).ops,1);
          pbVar2 = (byte *)pnVar6->attr;
          if ((*pbVar2 & 1) == 0) {
            c2m_ctx_local._4_4_ = 0;
          }
          else {
            local_b8 = *(type **)((long)r->attr + 0x18);
            if (local_b8->arr_type != (type *)0x0) {
              local_b8 = local_b8->arr_type;
            }
            mVar7 = type_size(c2m_ctx,local_b8);
            *deref = 1;
            *offset = *(long *)(pbVar2 + 0x30) * mVar7 + *offset;
            c2m_ctx_local._4_4_ = 1;
          }
        }
      }
      else {
        c2m_ctx_local._4_4_ = 0;
      }
      break;
    case N_FIELD:
    case N_DEREF_FIELD:
      pnVar6 = DLIST_node_t_head(&(r->u).ops);
      iVar5 = check_const_addr_p(c2m_ctx,pnVar6,base,offset,deref);
      if (iVar5 == 0) {
        c2m_ctx_local._4_4_ = 0;
      }
      else if (*deref == (uint)(r->code == N_FIELD)) {
        *deref = 1;
        if (*(long *)((long)r->attr + 8) != 0) {
          *offset = *(long *)(*(long *)(*(long *)((long)r->attr + 8) + 8) + 0x10) + *offset;
        }
        c2m_ctx_local._4_4_ = 1;
      }
      else {
        c2m_ctx_local._4_4_ = 0;
      }
      break;
    case N_ADDR:
    case N_DEREF:
      pnVar6 = DLIST_node_t_head(&(r->u).ops);
      pvVar3 = pnVar6->attr;
      iVar5 = check_const_addr_p(c2m_ctx,pnVar6,base,offset,deref);
      if (iVar5 == 0) {
        c2m_ctx_local._4_4_ = 0;
      }
      else {
        if ((r->code == N_ADDR) &&
           ((*(int *)(*(long *)((long)pvVar3 + 0x18) + 0x18) == 6 ||
            ((*(int *)(*(long *)((long)pvVar3 + 0x18) + 0x18) == 3 &&
             (*(long *)(*(long *)((long)pvVar3 + 0x18) + 8) != 0)))))) {
          if (0 < *deref) {
            *deref = *deref + -1;
          }
        }
        else if ((pnVar6->code != N_ID) ||
                ((**(int **)((long)pvVar3 + 0x10) != 0x7d &&
                 ((**(int **)((long)pvVar3 + 0x10) != 0x55 ||
                  (*(int *)(*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x10) + 8) + 0x40) + 0x18)
                   != 7)))))) {
          if (r->code == N_DEREF) {
            *deref = *deref + 1;
          }
          else {
            *deref = *deref + -1;
          }
        }
        c2m_ctx_local._4_4_ = 1;
      }
      break;
    case N_CAST:
      pnVar6 = DLIST_node_t_head(&(r->u).ops);
      mVar7 = type_size(c2m_ctx,*(type **)((long)pnVar6->attr + 0x18));
      if (mVar7 == 8) {
        pnVar6 = DLIST_node_t_el(&(r->u).ops,1);
        c2m_ctx_local._4_4_ = check_const_addr_p(c2m_ctx,pnVar6,base,offset,deref);
      }
      else {
        c2m_ctx_local._4_4_ = 0;
      }
      break;
    case N_LABEL_ADDR:
      *base = r;
      *offset = 0;
      *deref = 0;
      c2m_ctx_local._4_4_ = 1;
    }
  }
  else {
    *base = (node_t_conflict)0x0;
    *offset = *(mir_llong *)(pbVar2 + 0x30);
    *deref = 0;
    c2m_ctx_local._4_4_ = 1;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int check_const_addr_p (c2m_ctx_t c2m_ctx, node_t r, node_t *base, mir_llong *offset,
                               int *deref) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  struct expr *e = r->attr;
  struct type *type;
  node_t op1, op2, temp;
  decl_t decl;
  struct decl_spec *decl_spec;
  mir_size_t size;

  if (e->const_p && integer_type_p (e->type)) {
    *base = NULL;
    *offset = (mir_size_t) e->c.u_val;
    *deref = 0;
    return TRUE;
  }
  switch (r->code) {
  case N_STR:
  case N_STR16:
  case N_STR32:
    *base = r;
    *offset = 0;
    *deref = 0;
    return curr_scope == top_scope;
  case N_LABEL_ADDR:
    *base = r;
    *offset = 0;
    *deref = 0;
    return TRUE;
  case N_ID:
    if (e->def_node == NULL)
      return FALSE;
    else if (e->def_node->code == N_FUNC_DEF
             || (e->def_node->code == N_SPEC_DECL
                 && ((decl_t) e->def_node->attr)->decl_spec.type->mode == TM_FUNC)) {
      *base = e->def_node;
      *deref = 0;
    } else if (e->u.lvalue_node == NULL
               || ((decl = e->u.lvalue_node->attr)->scope != top_scope
                   && decl->decl_spec.linkage != N_IGNORE)) {
      return FALSE;
    } else {
      *base = e->def_node;
      *deref = e->type->arr_type == NULL;
    }
    *offset = 0;
    return TRUE;
  case N_DEREF:
  case N_ADDR: {
    node_t op = NL_HEAD (r->u.ops);
    struct expr *op_e = op->attr;

    if (!check_const_addr_p (c2m_ctx, op, base, offset, deref)) return FALSE;
    if (r->code == N_ADDR
        && (op_e->type->mode == TM_ARR
            || (op_e->type->mode == TM_PTR && op_e->type->arr_type != NULL))) {
      if (*deref > 0) (*deref)--;
    } else if (op->code != N_ID
               || (op_e->def_node->code != N_FUNC_DEF
                   && (op_e->def_node->code != N_SPEC_DECL
                       || ((decl_t) op_e->def_node->attr)->decl_spec.type->mode != TM_FUNC))) {
      r->code == N_DEREF ? (*deref)++ : (*deref)--;
    }
    return TRUE;
  }
  case N_FIELD:
  case N_DEREF_FIELD:
    if (!check_const_addr_p (c2m_ctx, NL_HEAD (r->u.ops), base, offset, deref)) return FALSE;
    if (*deref != (r->code == N_FIELD ? 1 : 0)) return FALSE;
    *deref = 1;
    e = r->attr;
    if (e->u.lvalue_node != NULL) {
      decl = e->u.lvalue_node->attr;
      *offset += decl->offset;
    }
    return TRUE;
  case N_IND:
    if (((struct expr *) NL_HEAD (r->u.ops)->attr)->type->mode != TM_PTR) return FALSE;
    if (!check_const_addr_p (c2m_ctx, NL_HEAD (r->u.ops), base, offset, deref)) return FALSE;
    if (!(e = NL_EL (r->u.ops, 1)->attr)->const_p) return FALSE;
    type = ((struct expr *) r->attr)->type;
    size = type_size (c2m_ctx, type->arr_type != NULL ? type->arr_type : type);
    *deref = 1;
    *offset += e->c.i_val * size;
    return TRUE;
  case N_ADD:
  case N_SUB:
    if ((op2 = NL_EL (r->u.ops, 1)) == NULL) return FALSE;
    op1 = NL_HEAD (r->u.ops);
    if (r->code == N_ADD && (e = op1->attr)->const_p) SWAP (op1, op2, temp);
    if (!check_const_addr_p (c2m_ctx, op1, base, offset, deref)) return FALSE;
    if (*deref != 0 && ((struct expr *) op1->attr)->type->arr_type == NULL) return FALSE;
    if (!(e = op2->attr)->const_p
        && (!e->const_addr_p || e->def_node == NULL || e->def_node->code != N_LABEL_ADDR))
      return FALSE;
    type = ((struct expr *) r->attr)->type;
    assert (type->mode == TM_BASIC || type->mode == TM_PTR);
    size = (type->mode == TM_BASIC || type->u.ptr_type->mode == TM_FUNC
              ? 1
              : type_size (c2m_ctx, type->u.ptr_type->arr_type != NULL ? type->u.ptr_type->arr_type
                                                                       : type->u.ptr_type));
    if (r->code == N_ADD)
      *offset += e->c.i_val * size;
    else
      *offset -= e->c.i_val * size;
    return TRUE;
  case N_CAST:
    decl_spec = NL_HEAD (r->u.ops)->attr;
    if (type_size (c2m_ctx, decl_spec->type) != sizeof (mir_size_t)) return FALSE;
    return check_const_addr_p (c2m_ctx, NL_EL (r->u.ops, 1), base, offset, deref);
  default: return FALSE;
  }
}